

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgemm.hpp
# Opt level: O2

void remora::bindings::ugemm<remora::bindings::gemm_block_size<float>,float,float>
               (size_t kc,float alpha,float *A,float *B,float *C,size_t stride1,size_t stride2)

{
  float fVar1;
  size_t c;
  long lVar2;
  size_t sVar3;
  undefined4 *puVar4;
  undefined4 *puVar5;
  size_t i;
  float *pfVar6;
  undefined4 *puVar7;
  size_t j;
  long lVar8;
  type Pa;
  undefined4 local_180 [90];
  
  puVar4 = local_180;
  puVar5 = local_180;
  for (lVar2 = 0; lVar2 != 0x40; lVar2 = lVar2 + 1) {
    local_180[lVar2] = 0;
  }
  for (sVar3 = 0; sVar3 != kc; sVar3 = sVar3 + 1) {
    puVar7 = local_180;
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      fVar1 = A[lVar2];
      for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 1) {
        *(float *)((long)puVar7 + lVar8 * 4) =
             B[lVar8] * fVar1 + *(float *)((long)puVar7 + lVar8 * 4);
      }
      puVar7 = (undefined4 *)((long)puVar7 + 0x40);
    }
    A = A + 4;
    B = B + 0x10;
  }
  if ((alpha != 1.0) || (NAN(alpha))) {
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 1) {
        *(float *)((long)puVar4 + lVar8 * 4) = *(float *)((long)puVar4 + lVar8 * 4) * alpha;
      }
      puVar4 = (undefined4 *)((long)puVar4 + 0x40);
    }
  }
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    pfVar6 = C;
    for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 1) {
      *pfVar6 = *(float *)((long)puVar5 + lVar8 * 4) + *pfVar6;
      pfVar6 = pfVar6 + stride2;
    }
    puVar5 = (undefined4 *)((long)puVar5 + 0x40);
    C = C + stride1;
  }
  return;
}

Assistant:

void ugemm(
	std::size_t kc, TC alpha, T const* A, T const* B,
	TC* C, std::size_t stride1, std::size_t stride2
){
	BOOST_ALIGN_ASSUME_ALIGNED(A, block_size::block::align);
	BOOST_ALIGN_ASSUME_ALIGNED(B, block_size::block::align);

	typedef typename block_size::block::type vx;
	static const std::size_t vector_length = block_size::block::vector_elements;
	static const std::size_t vecNR = block_size::nr/vector_length;
#ifdef REMORA_USE_SIMD
	vx P[block_size::mr * vecNR] = {};
#else
	typename std::aligned_storage<sizeof(vx[block_size::mr*vecNR]),block_size::block::align>::type Pa;
	T* P = reinterpret_cast<T*>(&Pa);
	for (std::size_t c = 0; c < block_size::mr*vecNR; c++)
		P[c] = 0;
#endif


	// perform the matrix-matrix product as outer product
	// of rows of A and B
	vx const* b = (vx const*)B;
	for (std::size_t l=0; l<kc; ++l) {
		for (std::size_t i=0; i<block_size::mr; ++i) {
			for (std::size_t j=0; j<vecNR; ++j) {
				P[i * vecNR+j] += A[i]*b[j];
			}
		}
		A += block_size::mr;
		b += vecNR;
	}
	//multiply with alpha if necessary
	if (alpha!=TC(1)) {
		for (std::size_t i=0; i<block_size::mr; ++i) {
			for (std::size_t j=0; j< vecNR; ++j) {
				P[i*vecNR+j] *= alpha;
			}
		}
	}

	//add result to C
	T const* p = (T const*) P;
	for (std::size_t i=0; i<block_size::mr; ++i) {
		for (std::size_t j=0; j<block_size::nr; ++j) {
			C[i * stride1+j * stride2] += p[i*block_size::nr+j];
		}
	}
}